

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O1

void __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::validate_compare_to_all_valid_elements
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *this,const_iterator *it)

{
  buffer_t<char> *this_00;
  pointer_type pcVar1;
  buffer_char_pointer pcVar2;
  memory_resource *pmVar3;
  ulong uVar4;
  const_iterator cur;
  polymorphic_allocator<char> local_20;
  
  this_00 = &(this->buffer_).v2_;
  buffer_t<char>::validate(this_00);
  pcVar1 = (this->buffer_).v2_.last;
  if (pcVar1 == (pointer_type)0x0) {
    pcVar2 = (buffer_char_pointer)0x0;
  }
  else {
    pcVar2 = pcVar1 + (*(long *)(pcVar1 + 0x10) + 0x1fU & 0xfffffffffffffff8);
  }
  if (pcVar2 != it->p_) {
    begin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)&local_20);
    while( true ) {
      buffer_t<char>::validate(this_00);
      pcVar1 = (this->buffer_).v2_.last;
      if (pcVar1 == (pointer_type)0x0) {
        pmVar3 = (memory_resource *)0x0;
      }
      else {
        pmVar3 = (memory_resource *)
                 (pcVar1 + (*(long *)(pcVar1 + 0x10) + 0x1fU & 0xfffffffffffffff8));
      }
      if (local_20._M_resource == pmVar3) {
        std::terminate();
      }
      if (local_20._M_resource == (memory_resource *)it->p_) break;
      uVar4 = *(ulong *)local_20._M_resource;
      if (uVar4 == 0) {
        uVar4 = *(ulong *)(local_20._M_resource + 0x10) + 0x1f & 0xfffffffffffffff8;
      }
      local_20._M_resource = local_20._M_resource + uVar4;
    }
  }
  return;
}

Assistant:

void validate_compare_to_all_valid_elements([[maybe_unused]] const_iterator const &it) const noexcept {
#ifdef FFL_DBG_CHECK_ITERATOR_VALID
        //
        // If not end iterator then must point to one of the valid iterators.
        //
        if (end() != it) {
            bool found_match{ false };
            for (auto cur = cbegin(); cur != cend(); ++cur) {
                if (cur == it) {
                    found_match = true;
                    break;
                }
            }
            FFL_CODDING_ERROR_IF_NOT(found_match);
        }
#else //FFL_DBG_CHECK_ITERATOR_VALID
        it;
#endif //FFL_DBG_CHECK_ITERATOR_VALID
    }